

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gost_prov_cipher.c
# Opt level: O0

int cipher_get_ctx_params(void *vgctx,OSSL_PARAM *params)

{
  int iVar1;
  long lVar2;
  ASN1_TYPE *type;
  undefined8 in_RSI;
  long in_RDI;
  size_t taglen;
  void *tag;
  size_t ivlen;
  void *iv;
  int ret;
  int derlen;
  uchar *der;
  ASN1_TYPE *algidparam;
  OSSL_PARAM *p;
  GOST_CTX *gctx;
  bool local_61;
  undefined8 local_60;
  void *local_58;
  long local_50;
  undefined8 local_48;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  EVP_CIPHER *in_stack_ffffffffffffffc8;
  uchar *ptr;
  uint local_4;
  
  iVar1 = cipher_get_params(in_stack_ffffffffffffffc8,
                            (OSSL_PARAM *)
                            CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
  if (iVar1 == 0) {
    local_4 = 0;
  }
  else {
    lVar2 = OSSL_PARAM_locate(in_RSI,"alg_id_param");
    if (lVar2 == 0) {
      lVar2 = OSSL_PARAM_locate(in_RSI,"updated-iv");
      if (lVar2 != 0) {
        local_48 = EVP_CIPHER_CTX_iv(*(undefined8 *)(in_RDI + 0x20));
        iVar1 = EVP_CIPHER_CTX_get_iv_length(*(undefined8 *)(in_RDI + 0x20));
        local_50 = (long)iVar1;
        iVar1 = OSSL_PARAM_set_octet_ptr(lVar2,local_48,local_50);
        if ((iVar1 == 0) &&
           (iVar1 = OSSL_PARAM_set_octet_string(lVar2,local_48,local_50), iVar1 == 0)) {
          return 0;
        }
      }
      lVar2 = OSSL_PARAM_locate(in_RSI,"tag");
      if (lVar2 != 0) {
        local_58 = (void *)0x0;
        local_60 = 0;
        iVar1 = OSSL_PARAM_get_octet_string_ptr(lVar2,&local_58,&local_60);
        if ((iVar1 == 0) ||
           (iVar1 = EVP_CIPHER_CTX_ctrl(*(EVP_CIPHER_CTX **)(in_RDI + 0x20),0x10,(int)local_60,
                                        local_58), iVar1 < 1)) {
          return 0;
        }
      }
      local_4 = 1;
    }
    else {
      ptr = (uchar *)0x0;
      type = ASN1_TYPE_new();
      local_61 = false;
      if (type != (ASN1_TYPE *)0x0) {
        iVar1 = EVP_CIPHER_param_to_asn1(*(EVP_CIPHER_CTX **)(in_RDI + 0x20),type);
        local_61 = false;
        if (0 < iVar1) {
          iVar1 = i2d_ASN1_TYPE(type,(uchar **)&stack0xffffffffffffffc8);
          local_61 = false;
          if (-1 < iVar1) {
            iVar1 = OSSL_PARAM_set_octet_string(lVar2,&stack0xffffffffffffffc8,(long)iVar1);
            local_61 = iVar1 != 0;
          }
        }
      }
      local_4 = (uint)local_61;
      CRYPTO_free(ptr);
      ASN1_TYPE_free(type);
    }
  }
  return local_4;
}

Assistant:

static int cipher_get_ctx_params(void *vgctx, OSSL_PARAM params[])
{
    GOST_CTX *gctx = vgctx;
    OSSL_PARAM *p;

    if (!cipher_get_params(gctx->cipher, params))
        return 0;
    if ((p = OSSL_PARAM_locate(params, "alg_id_param")) != NULL) {
        ASN1_TYPE *algidparam = NULL;
        unsigned char *der = NULL;
        int derlen = 0;
        int ret;

        ret = (algidparam = ASN1_TYPE_new()) != NULL
            && EVP_CIPHER_param_to_asn1(gctx->cctx, algidparam) > 0
            && (derlen = i2d_ASN1_TYPE(algidparam, &der)) >= 0
            && OSSL_PARAM_set_octet_string(p, &der, (size_t)derlen);

        OPENSSL_free(der);
        ASN1_TYPE_free(algidparam);
        return ret;
    }
    if ((p = OSSL_PARAM_locate(params, "updated-iv")) != NULL) {
        const void *iv = EVP_CIPHER_CTX_iv(gctx->cctx);
        size_t ivlen = EVP_CIPHER_CTX_iv_length(gctx->cctx);

        if (!OSSL_PARAM_set_octet_ptr(p, iv, ivlen)
            && !OSSL_PARAM_set_octet_string(p, iv, ivlen))
            return 0;
    }
    if ((p = OSSL_PARAM_locate(params, OSSL_CIPHER_PARAM_AEAD_TAG)) != NULL) {
        void *tag = NULL;
        size_t taglen = 0;

        if (!OSSL_PARAM_get_octet_string_ptr(p, (const void**)&tag, &taglen)
            || EVP_CIPHER_CTX_ctrl(gctx->cctx, EVP_CTRL_AEAD_GET_TAG,
                                   taglen, tag) <= 0)
            return 0;
    }
    return 1;
}